

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O3

int __thiscall deci_FlexLexer::yy_get_next_buffer(deci_FlexLexer *this)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  yy_buffer_state **ppyVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  yy_buffer_state *pyVar12;
  int iVar13;
  
  pyVar12 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  pcVar7 = pyVar12->yy_ch_buf;
  pcVar2 = (this->super_FlexLexer).yytext;
  if (pcVar7 + (long)this->yy_n_chars + 1 < this->yy_c_buf_p) {
    (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
              (this,"fatal flex scanner internal error--end of buffer missed");
    pyVar12 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  }
  pcVar6 = (this->super_FlexLexer).yytext;
  if (pyVar12->yy_fill_buffer == 0) {
    return ((long)this->yy_c_buf_p - (long)pcVar6 != 1) + 1;
  }
  uVar11 = ~(uint)pcVar6 + (int)this->yy_c_buf_p;
  if (0 < (int)uVar11) {
    lVar8 = 0;
    do {
      pcVar7[lVar8] = pcVar2[lVar8];
      lVar8 = lVar8 + 1;
    } while (uVar11 != (uint)lVar8);
    pyVar12 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  }
  if (pyVar12->yy_buffer_status == 2) {
    this->yy_n_chars = 0;
    pyVar12->yy_n_chars = 0;
  }
  else {
    iVar5 = pyVar12->yy_buf_size;
    uVar1 = iVar5 + ~uVar11;
    if ((int)uVar1 < 1) {
      pcVar7 = this->yy_c_buf_p;
      do {
        pcVar2 = pyVar12->yy_ch_buf;
        if (pyVar12->yy_is_our_buffer == 0) {
          pyVar12->yy_ch_buf = (char *)0x0;
LAB_0011219d:
          (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                    (this,"fatal error - scanner input buffer overflow");
          pcVar6 = pyVar12->yy_ch_buf;
        }
        else {
          iVar10 = iVar5 - ((uint)-iVar5 >> 3);
          if (0 < iVar5) {
            iVar10 = iVar5 * 2;
          }
          pyVar12->yy_buf_size = iVar10;
          pcVar6 = (char *)realloc(pcVar2,(long)(iVar10 + 2));
          pyVar12->yy_ch_buf = pcVar6;
          if (pcVar6 == (char *)0x0) goto LAB_0011219d;
        }
        pcVar7 = pcVar6 + ((int)pcVar7 - (int)pcVar2);
        this->yy_c_buf_p = pcVar7;
        pyVar12 = this->yy_buffer_stack[this->yy_buffer_stack_top];
        iVar5 = pyVar12->yy_buf_size;
        uVar1 = iVar5 + ~uVar11;
      } while ((int)uVar1 < 1);
    }
    uVar9 = 0x2000;
    if (uVar1 < 0x2000) {
      uVar9 = (ulong)uVar1;
    }
    iVar5 = (*(this->super_FlexLexer)._vptr_FlexLexer[0xc])
                      (this,pyVar12->yy_ch_buf + (int)uVar11,uVar9);
    this->yy_n_chars = iVar5;
    if (iVar5 < 0) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])(this,"input in flex scanner failed");
      iVar5 = this->yy_n_chars;
    }
    pyVar12 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    pyVar12->yy_n_chars = iVar5;
    iVar10 = 0;
    if (iVar5 != 0) goto LAB_00112278;
  }
  if (uVar11 == 0) {
    (*(this->super_FlexLexer)._vptr_FlexLexer[7])(this,&this->yyin);
    iVar5 = this->yy_n_chars;
    pyVar12 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    iVar10 = 1;
  }
  else {
    pyVar12->yy_buffer_status = 2;
    iVar10 = 2;
    iVar5 = 0;
  }
LAB_00112278:
  iVar13 = iVar5 + uVar11;
  if (pyVar12->yy_buf_size < iVar13) {
    iVar13 = iVar13 + (iVar5 >> 1);
    pcVar7 = (char *)realloc(pyVar12->yy_ch_buf,(long)iVar13);
    sVar3 = this->yy_buffer_stack_top;
    ppyVar4 = this->yy_buffer_stack;
    ppyVar4[sVar3]->yy_ch_buf = pcVar7;
    pyVar12 = ppyVar4[sVar3];
    if (pyVar12->yy_ch_buf == (char *)0x0) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
                (this,"out of dynamic memory in yy_get_next_buffer()");
      pyVar12 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    }
    pyVar12->yy_buf_size = iVar13 + -2;
    iVar13 = this->yy_n_chars + uVar11;
  }
  this->yy_n_chars = iVar13;
  pyVar12->yy_ch_buf[iVar13] = '\0';
  this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf[(long)this->yy_n_chars + 1] = '\0';
  (this->super_FlexLexer).yytext = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf;
  return iVar10;
}

Assistant:

int yyFlexLexer::yy_get_next_buffer()
{
    	char *dest = YY_CURRENT_BUFFER_LVALUE->yy_ch_buf;
	char *source = (yytext_ptr);
	int number_to_move, i;
	int ret_val;

	if ( (yy_c_buf_p) > &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] )
		YY_FATAL_ERROR(
		"fatal flex scanner internal error--end of buffer missed" );

	if ( YY_CURRENT_BUFFER_LVALUE->yy_fill_buffer == 0 )
		{ /* Don't try to fill the buffer, so this is an EOF. */
		if ( (yy_c_buf_p) - (yytext_ptr) - YY_MORE_ADJ == 1 )
			{
			/* We matched a single character, the EOB, so
			 * treat this as a final EOF.
			 */
			return EOB_ACT_END_OF_FILE;
			}

		else
			{
			/* We matched some text prior to the EOB, first
			 * process it.
			 */
			return EOB_ACT_LAST_MATCH;
			}
		}

	/* Try to read more data. */

	/* First move last chars to start of buffer. */
	number_to_move = (int) ((yy_c_buf_p) - (yytext_ptr) - 1);

	for ( i = 0; i < number_to_move; ++i )
		*(dest++) = *(source++);

	if ( YY_CURRENT_BUFFER_LVALUE->yy_buffer_status == YY_BUFFER_EOF_PENDING )
		/* don't do the read, it's not guaranteed to return an EOF,
		 * just force an EOF
		 */
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars) = 0;

	else
		{
			int num_to_read =
			YY_CURRENT_BUFFER_LVALUE->yy_buf_size - number_to_move - 1;

		while ( num_to_read <= 0 )
			{ /* Not enough room in the buffer - grow it. */

			/* just a shorter name for the current buffer */
			YY_BUFFER_STATE b = YY_CURRENT_BUFFER_LVALUE;

			int yy_c_buf_p_offset =
				(int) ((yy_c_buf_p) - b->yy_ch_buf);

			if ( b->yy_is_our_buffer )
				{
				int new_size = b->yy_buf_size * 2;

				if ( new_size <= 0 )
					b->yy_buf_size += b->yy_buf_size / 8;
				else
					b->yy_buf_size *= 2;

				b->yy_ch_buf = (char *)
					/* Include room in for 2 EOB chars. */
					yyrealloc( (void *) b->yy_ch_buf,
							 (yy_size_t) (b->yy_buf_size + 2)  );
				}
			else
				/* Can't grow it, we don't own it. */
				b->yy_ch_buf = NULL;

			if ( ! b->yy_ch_buf )
				YY_FATAL_ERROR(
				"fatal error - scanner input buffer overflow" );

			(yy_c_buf_p) = &b->yy_ch_buf[yy_c_buf_p_offset];

			num_to_read = YY_CURRENT_BUFFER_LVALUE->yy_buf_size -
						number_to_move - 1;

			}

		if ( num_to_read > YY_READ_BUF_SIZE )
			num_to_read = YY_READ_BUF_SIZE;

		/* Read in more data. */
		YY_INPUT( (&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move]),
			(yy_n_chars), num_to_read );

		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	if ( (yy_n_chars) == 0 )
		{
		if ( number_to_move == YY_MORE_ADJ )
			{
			ret_val = EOB_ACT_END_OF_FILE;
			yyrestart( yyin  );
			}

		else
			{
			ret_val = EOB_ACT_LAST_MATCH;
			YY_CURRENT_BUFFER_LVALUE->yy_buffer_status =
				YY_BUFFER_EOF_PENDING;
			}
		}

	else
		ret_val = EOB_ACT_CONTINUE_SCAN;

	if (((yy_n_chars) + number_to_move) > YY_CURRENT_BUFFER_LVALUE->yy_buf_size) {
		/* Extend the array by 50%, plus the number we really need. */
		int new_size = (yy_n_chars) + number_to_move + ((yy_n_chars) >> 1);
		YY_CURRENT_BUFFER_LVALUE->yy_ch_buf = (char *) yyrealloc(
			(void *) YY_CURRENT_BUFFER_LVALUE->yy_ch_buf, (yy_size_t) new_size  );
		if ( ! YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			YY_FATAL_ERROR( "out of dynamic memory in yy_get_next_buffer()" );
		/* "- 2" to take care of EOB's */
		YY_CURRENT_BUFFER_LVALUE->yy_buf_size = (int) (new_size - 2);
	}

	(yy_n_chars) += number_to_move;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] = YY_END_OF_BUFFER_CHAR;
	YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars) + 1] = YY_END_OF_BUFFER_CHAR;

	(yytext_ptr) = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[0];

	return ret_val;
}